

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

_Bool Curl_ssl_getsessionid(Curl_cfilter *cf,Curl_easy *data,void **ssl_sessionid,size_t *idsize)

{
  void *pvVar1;
  _Bool _Var2;
  int iVar3;
  ssl_primary_config *c1;
  ssl_config_data *psVar4;
  Curl_ssl_session *pCVar5;
  long *plStack_60;
  _Bool no_match;
  long *general_age;
  size_t i;
  Curl_ssl_session *check;
  ssl_config_data *ssl_config;
  ssl_primary_config *conn_config;
  ssl_connect_data *connssl;
  size_t *idsize_local;
  void **ssl_sessionid_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  pvVar1 = cf->ctx;
  c1 = Curl_ssl_cf_get_primary_config(cf);
  psVar4 = Curl_ssl_cf_get_config(cf,data);
  *ssl_sessionid = (void *)0x0;
  if (((psVar4 != (ssl_config_data *)0x0) && (((byte)(psVar4->primary).field_0x69 >> 3 & 1) != 0))
     && ((data->state).session != (Curl_ssl_session *)0x0)) {
    if ((data->share == (Curl_share *)0x0) || ((data->share->specifier & 0x10) == 0)) {
      plStack_60 = &(data->state).sessionage;
    }
    else {
      plStack_60 = &data->share->sessionage;
    }
    for (general_age = (long *)0x0; general_age < (long *)(data->set).general_ssl.max_ssl_sessions;
        general_age = (long *)((long)general_age + 1)) {
      pCVar5 = (data->state).session + (long)general_age;
      if (((((pCVar5->sessionid != (void *)0x0) &&
            (iVar3 = curl_strequal(*(char **)((long)pvVar1 + 8),pCVar5->name), iVar3 != 0)) &&
           (((((uint)cf->conn->bits >> 9 & 1) == 0 && (pCVar5->conn_to_host == (char *)0x0)) ||
            (((((uint)cf->conn->bits >> 9 & 1) != 0 && (pCVar5->conn_to_host != (char *)0x0)) &&
             (iVar3 = curl_strequal((cf->conn->conn_to_host).name,pCVar5->conn_to_host), iVar3 != 0)
             ))))) &&
          (((((uint)cf->conn->bits >> 10 & 1) == 0 && (pCVar5->conn_to_port == -1)) ||
           ((((uint)cf->conn->bits >> 10 & 1) != 0 &&
            ((pCVar5->conn_to_port != -1 && (cf->conn->conn_to_port == pCVar5->conn_to_port))))))))
         && ((*(int *)((long)pvVar1 + 0x50) == pCVar5->remote_port &&
             ((iVar3 = curl_strequal(cf->conn->handler->scheme,pCVar5->scheme), iVar3 != 0 &&
              (_Var2 = match_ssl_primary_config(data,c1,&pCVar5->ssl_config), _Var2)))))) {
        *plStack_60 = *plStack_60 + 1;
        pCVar5->age = *plStack_60;
        *ssl_sessionid = pCVar5->sessionid;
        if (idsize != (size_t *)0x0) {
          *idsize = pCVar5->idsize;
        }
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool Curl_ssl_getsessionid(struct Curl_cfilter *cf,
                           struct Curl_easy *data,
                           void **ssl_sessionid,
                           size_t *idsize) /* set 0 if unknown */
{
  struct ssl_connect_data *connssl = cf->ctx;
  struct ssl_primary_config *conn_config = Curl_ssl_cf_get_primary_config(cf);
  struct ssl_config_data *ssl_config = Curl_ssl_cf_get_config(cf, data);
  struct Curl_ssl_session *check;
  size_t i;
  long *general_age;
  bool no_match = TRUE;

  *ssl_sessionid = NULL;
  if(!ssl_config)
    return TRUE;

  DEBUGASSERT(ssl_config->primary.sessionid);

  if(!ssl_config->primary.sessionid || !data->state.session)
    /* session ID reuse is disabled or the session cache has not been
       setup */
    return TRUE;

  /* Lock if shared */
  if(SSLSESSION_SHARED(data))
    general_age = &data->share->sessionage;
  else
    general_age = &data->state.sessionage;

  for(i = 0; i < data->set.general_ssl.max_ssl_sessions; i++) {
    check = &data->state.session[i];
    if(!check->sessionid)
      /* not session ID means blank entry */
      continue;
    if(strcasecompare(connssl->peer.hostname, check->name) &&
       ((!cf->conn->bits.conn_to_host && !check->conn_to_host) ||
        (cf->conn->bits.conn_to_host && check->conn_to_host &&
         strcasecompare(cf->conn->conn_to_host.name, check->conn_to_host))) &&
       ((!cf->conn->bits.conn_to_port && check->conn_to_port == -1) ||
        (cf->conn->bits.conn_to_port && check->conn_to_port != -1 &&
         cf->conn->conn_to_port == check->conn_to_port)) &&
       (connssl->port == check->remote_port) &&
       strcasecompare(cf->conn->handler->scheme, check->scheme) &&
       match_ssl_primary_config(data, conn_config, &check->ssl_config)) {
      /* yes, we have a session ID! */
      (*general_age)++;          /* increase general age */
      check->age = *general_age; /* set this as used in this age */
      *ssl_sessionid = check->sessionid;
      if(idsize)
        *idsize = check->idsize;
      no_match = FALSE;
      break;
    }
  }

  DEBUGF(infof(data, "%s Session ID in cache for %s %s://%s:%d",
               no_match? "Didn't find": "Found",
               Curl_ssl_cf_is_proxy(cf) ? "proxy" : "host",
               cf->conn->handler->scheme, connssl->peer.hostname,
               connssl->port));
  return no_match;
}